

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O0

bool __thiscall
pstore::json::details::number_matcher<pstore::exchange::import_ns::callbacks>::
do_integer_initial_digit_state
          (number_matcher<pstore::exchange::import_ns::callbacks> *this,
          parser<pstore::exchange::import_ns::callbacks> *parser,char c)

{
  parser<pstore::exchange::import_ns::callbacks> *parser_00;
  int iVar1;
  error_code local_30;
  char local_19;
  parser<pstore::exchange::import_ns::callbacks> *ppStack_18;
  char c_local;
  parser<pstore::exchange::import_ns::callbacks> *parser_local;
  number_matcher<pstore::exchange::import_ns::callbacks> *this_local;
  
  local_19 = c;
  ppStack_18 = parser;
  parser_local = (parser<pstore::exchange::import_ns::callbacks> *)this;
  iVar1 = matcher<pstore::exchange::import_ns::callbacks>::get_state
                    (&this->super_matcher<pstore::exchange::import_ns::callbacks>);
  parser_00 = ppStack_18;
  if (iVar1 != 3) {
    assert_failed("this->get_state () == integer_initial_digit_state",
                  "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/json/json.hpp"
                  ,0x2c3);
  }
  if (((this->super_matcher<pstore::exchange::import_ns::callbacks>).field_0xd & 1) == 0) {
    assert_failed("is_integer_",
                  "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/json/json.hpp"
                  ,0x2c4);
  }
  if (local_19 == '0') {
    matcher<pstore::exchange::import_ns::callbacks>::set_state
              (&this->super_matcher<pstore::exchange::import_ns::callbacks>,5);
  }
  else if ((local_19 < '1') || ('9' < local_19)) {
    std::error_code::error_code<pstore::json::error_code,void>(&local_30,unrecognized_token);
    matcher<pstore::exchange::import_ns::callbacks>::set_error
              (&this->super_matcher<pstore::exchange::import_ns::callbacks>,parser_00,&local_30);
  }
  else {
    if (this->int_acc_ != 0) {
      assert_failed("int_acc_ == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/json/json.hpp"
                    ,0x2c8);
    }
    this->int_acc_ = (ulong)((int)local_19 - 0x30);
    matcher<pstore::exchange::import_ns::callbacks>::set_state
              (&this->super_matcher<pstore::exchange::import_ns::callbacks>,4);
  }
  return true;
}

Assistant:

bool
            number_matcher<Callbacks>::do_integer_initial_digit_state (parser<Callbacks> & parser,
                                                                       char const c) {
                PSTORE_ASSERT (this->get_state () == integer_initial_digit_state);
                PSTORE_ASSERT (is_integer_);
                if (c == '0') {
                    this->set_state (frac_state);
                } else if (c >= '1' && c <= '9') {
                    PSTORE_ASSERT (int_acc_ == 0);
                    int_acc_ = static_cast<unsigned> (c - '0');
                    this->set_state (integer_digit_state);
                } else {
                    this->set_error (parser, error_code::unrecognized_token);
                }
                return true;
            }